

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  cmMakefile *this_01;
  cmake *pcVar2;
  string *psVar3;
  const_iterator ppvVar4;
  reference pbVar5;
  string *ext;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  value_type exts;
  const_iterator __end1;
  const_iterator __begin1;
  array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
  *__range1;
  string err;
  undefined1 local_a0 [8];
  anon_class_24_3_964a6fe1 findInDir;
  undefined1 local_78 [8];
  array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
  extsLists;
  string lPath;
  cmMakefile *makefile;
  string *local_20;
  string *error_local;
  cmSourceFile *this_local;
  
  local_20 = error;
  error_local = (string *)this;
  bVar1 = GetIsGenerated(this);
  if (bVar1) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)&makefile,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&makefile);
    std::__cxx11::string::~string((string *)&makefile);
    this_local._7_1_ = 1;
    goto LAB_004cb2cf;
  }
  if ((this->FindFullPathFailed & 1U) != 0) {
    this_local._7_1_ = 0;
    goto LAB_004cb2cf;
  }
  this_01 = cmSourceFileLocation::GetMakefile(&this->Location);
  cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)(extsLists._M_elems + 1),&this->Location);
  pcVar2 = cmMakefile::GetCMakeInstance(this_01);
  local_78 = (undefined1  [8])cmake::GetSourceExtensions_abi_cxx11_(pcVar2);
  pcVar2 = cmMakefile::GetCMakeInstance(this_01);
  extsLists._M_elems[0] = cmake::GetHeaderExtensions_abi_cxx11_(pcVar2);
  findInDir.this = (cmSourceFile *)local_78;
  findInDir.extsLists =
       (array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
        *)(extsLists._M_elems + 1);
  local_a0 = (undefined1  [8])this;
  bVar1 = cmSourceFileLocation::DirectoryIsAmbiguous(&this->Location);
  if (bVar1) {
    psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_01);
    bVar1 = FindFullPath::anon_class_24_3_964a6fe1::operator()
                      ((anon_class_24_3_964a6fe1 *)local_a0,psVar3);
    if (!bVar1) {
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
      bVar1 = FindFullPath::anon_class_24_3_964a6fe1::operator()
                        ((anon_class_24_3_964a6fe1 *)local_a0,psVar3);
      if (!bVar1) goto LAB_004cb0ed;
    }
    this_local._7_1_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    bVar1 = FindFullPath::anon_class_24_3_964a6fe1::operator()
                      ((anon_class_24_3_964a6fe1 *)local_a0,(string *)(err.field_2._M_local_buf + 8)
                      );
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
LAB_004cb0ed:
      std::__cxx11::string::string((string *)&__range1);
      std::__cxx11::string::operator+=((string *)&__range1,"Cannot find source file:\n  ");
      std::__cxx11::string::operator+=((string *)&__range1,(string *)(extsLists._M_elems + 1));
      std::__cxx11::string::operator+=((string *)&__range1,"\nTried extensions");
      __end1 = std::
               array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
               ::begin((array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
                        *)local_78);
      ppvVar4 = std::
                array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
                ::end((array<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_2UL>
                       *)local_78);
      for (; __end1 != ppvVar4; __end1 = __end1 + 1) {
        this_00 = *__end1;
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_00);
        ext = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&ext), bVar1) {
          pbVar5 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          std::__cxx11::string::operator+=((string *)&__range1," .");
          std::__cxx11::string::operator+=((string *)&__range1,(string *)pbVar5);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      if (local_20 == (string *)0x0) {
        cmMakefile::IssueMessage(this_01,FATAL_ERROR,(string *)&__range1);
      }
      else {
        std::__cxx11::string::operator=((string *)local_20,(string *)&__range1);
      }
      this->FindFullPathFailed = true;
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)&__range1);
    }
  }
  std::__cxx11::string::~string((string *)(extsLists._M_elems + 1));
LAB_004cb2cf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error)
{
  // If the file is generated compute the location without checking on disk.
  if (this->GetIsGenerated()) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const lPath = this->Location.GetFullPath();
  // List of extension lists
  std::array<std::vector<std::string> const*, 2> const extsLists = {
    { &makefile->GetCMakeInstance()->GetSourceExtensions(),
      &makefile->GetCMakeInstance()->GetHeaderExtensions() }
  };

  // Tries to find the file in a given directory
  auto findInDir = [this, &extsLists, &lPath](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    if (cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // Try full path with extension
    for (auto exts : extsLists) {
      for (std::string const& ext : *exts) {
        if (!ext.empty()) {
          std::string extPath = fullPath;
          extPath += '.';
          extPath += ext;
          if (cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err;
  err += "Cannot find source file:\n  ";
  err += lPath;
  err += "\nTried extensions";
  for (auto exts : extsLists) {
    for (std::string const& ext : *exts) {
      err += " .";
      err += ext;
    }
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}